

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

YamlTag_e __thiscall c4::yml::to_tag(yml *this,csubstr tag)

{
  code *pcVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  YamlTag_e YVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  basic_substring<const_char> local_20;
  basic_substring<const_char> local_10;
  
  local_20.len = (size_t)tag.str;
  local_20.str = (char *)this;
  if (((char *)0x1 < local_20.len) && (*this == (yml)0x21)) {
    lVar2 = 0;
    do {
      lVar7 = lVar2;
      if (lVar7 == 1) break;
      lVar2 = lVar7 + 1;
    } while (this[lVar7 + 1] == *(yml *)("!<" + lVar7 + 1));
    if (lVar7 != 0) {
      basic_substring<const_char>::basic_substring
                (&local_10,(char *)(this + 1),(size_t)(local_20.len + -1));
      local_20.str = local_10.str;
      local_20.len = local_10.len;
    }
  }
  if ((local_20.len < (char *)0x2) || ((yml)*local_20.str != (yml)0x21)) {
LAB_001c5aea:
    if (((char *)local_20.len != (char *)0x0) && ((yml)*local_20.str == (yml)0x21)) {
      return TAG_NONE;
    }
    if (((char *)0x11 < local_20.len) && ((yml)*local_20.str == (yml)0x74)) {
      uVar3 = 0;
      do {
        uVar8 = uVar3;
        if (uVar8 == 0x11) break;
        uVar3 = uVar8 + 1;
      } while (*(yml *)(local_20.str + uVar8 + 1) == *(yml *)("<tag:yaml.org,2002:" + uVar8 + 2));
      if (0x10 < uVar8) {
        if (local_20.len < (char *)0x12) {
          if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar1 = (code *)swi(3);
            YVar5 = (*pcVar1)();
            return YVar5;
          }
          handle_error(0x21a325,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_10,(char *)(local_20.str + 0x12),(size_t)(local_20.len + -0x12));
        goto LAB_001c5bfd;
      }
    }
    if ((local_20.len < (char *)0x13) || ((yml)*local_20.str != (yml)0x3c)) goto LAB_001c5c11;
    uVar3 = 0;
    do {
      uVar8 = uVar3;
      if (uVar8 == 0x12) break;
      uVar3 = uVar8 + 1;
    } while (*(yml *)(local_20.str + uVar8 + 1) == *(yml *)("<tag:yaml.org,2002:" + uVar8 + 1));
    if (uVar8 < 0x12) goto LAB_001c5c11;
    if (local_20.len < (char *)0x13) {
      if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar1 = (code *)swi(3);
        YVar5 = (*pcVar1)();
        return YVar5;
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_10,(char *)(local_20.str + 0x13),(size_t)(local_20.len + -0x13));
    local_20.str = local_10.str;
    local_20.len = local_10.len;
    if ((char *)local_10.len == (char *)0x0) {
      return TAG_NONE;
    }
    basic_substring<const_char>::basic_substring(&local_10,local_10.str,(size_t)(local_10.len + -1))
    ;
  }
  else {
    lVar2 = 0;
    do {
      lVar7 = lVar2;
      if (lVar7 == 1) break;
      lVar2 = lVar7 + 1;
    } while (*(yml *)(local_20.str + lVar7 + 1) == *(yml *)("!!" + lVar7 + 1));
    if (lVar7 == 0) goto LAB_001c5aea;
    if (local_20.len < (char *)0x2) {
      if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar1 = (code *)swi(3);
        YVar5 = (*pcVar1)();
        return YVar5;
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_10,(char *)(local_20.str + 2),(size_t)(local_20.len + -2));
  }
LAB_001c5bfd:
  local_20.str = local_10.str;
  local_20.len = local_10.len;
LAB_001c5c11:
  iVar6 = basic_substring<const_char>::compare(&local_20,"map",3);
  if (iVar6 == 0) {
    YVar5 = TAG_MAP;
  }
  else {
    iVar6 = basic_substring<const_char>::compare(&local_20,"omap",4);
    if (iVar6 == 0) {
      YVar5 = TAG_OMAP;
    }
    else {
      iVar6 = basic_substring<const_char>::compare(&local_20,"pairs",5);
      if (iVar6 == 0) {
        YVar5 = TAG_PAIRS;
      }
      else {
        iVar6 = basic_substring<const_char>::compare(&local_20,"set",3);
        if (iVar6 == 0) {
          YVar5 = TAG_SET;
        }
        else {
          iVar6 = basic_substring<const_char>::compare(&local_20,"seq",3);
          if (iVar6 == 0) {
            YVar5 = TAG_SEQ;
          }
          else {
            iVar6 = basic_substring<const_char>::compare(&local_20,"binary",6);
            if (iVar6 == 0) {
              YVar5 = TAG_BINARY;
            }
            else {
              iVar6 = basic_substring<const_char>::compare(&local_20,"bool",4);
              if (iVar6 == 0) {
                YVar5 = TAG_BOOL;
              }
              else {
                iVar6 = basic_substring<const_char>::compare(&local_20,"float",5);
                if (iVar6 == 0) {
                  YVar5 = TAG_FLOAT;
                }
                else {
                  iVar6 = basic_substring<const_char>::compare(&local_20,"int",3);
                  if (iVar6 == 0) {
                    YVar5 = TAG_INT;
                  }
                  else {
                    iVar6 = basic_substring<const_char>::compare(&local_20,"merge",5);
                    if (iVar6 == 0) {
                      YVar5 = TAG_MERGE;
                    }
                    else {
                      iVar6 = basic_substring<const_char>::compare(&local_20,"null",4);
                      if (iVar6 == 0) {
                        YVar5 = TAG_NULL;
                      }
                      else {
                        iVar6 = basic_substring<const_char>::compare(&local_20,"str",3);
                        if (iVar6 == 0) {
                          YVar5 = TAG_STR;
                        }
                        else {
                          iVar6 = basic_substring<const_char>::compare(&local_20,"timestamp",9);
                          if (iVar6 == 0) {
                            YVar5 = TAG_TIMESTAMP;
                          }
                          else {
                            iVar6 = basic_substring<const_char>::compare(&local_20,"value",5);
                            YVar5 = TAG_VALUE;
                            if (iVar6 != 0) {
                              YVar5 = TAG_NONE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return YVar5;
}

Assistant:

YamlTag_e to_tag(csubstr tag)
{
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("!!"))
        tag = tag.sub(2);
    else if(tag.begins_with('!'))
        return TAG_NONE;
    else if(tag.begins_with("tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("tag:yaml.org,2002:").len == 18);
        tag = tag.sub(18);
    }
    else if(tag.begins_with("<tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("<tag:yaml.org,2002:").len == 19);
        tag = tag.sub(19);
        if(!tag.len)
            return TAG_NONE;
        tag = tag.offs(0, 1);
    }

    if(tag == "map")
        return TAG_MAP;
    else if(tag == "omap")
        return TAG_OMAP;
    else if(tag == "pairs")
        return TAG_PAIRS;
    else if(tag == "set")
        return TAG_SET;
    else if(tag == "seq")
        return TAG_SEQ;
    else if(tag == "binary")
        return TAG_BINARY;
    else if(tag == "bool")
        return TAG_BOOL;
    else if(tag == "float")
        return TAG_FLOAT;
    else if(tag == "int")
        return TAG_INT;
    else if(tag == "merge")
        return TAG_MERGE;
    else if(tag == "null")
        return TAG_NULL;
    else if(tag == "str")
        return TAG_STR;
    else if(tag == "timestamp")
        return TAG_TIMESTAMP;
    else if(tag == "value")
        return TAG_VALUE;

    return TAG_NONE;
}